

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

word Ifd_ObjTruth(Ifd_Man_t *p,int iLit)

{
  int iVar1;
  Ifd_Man_t *local_40;
  int local_2c;
  Ifd_Man_t *pIStack_28;
  int Counter;
  word Fun;
  Ifd_Man_t *pIStack_18;
  int iLit_local;
  Ifd_Man_t *p_local;
  
  local_2c = 0;
  if (iLit == 0) {
    p_local = (Ifd_Man_t *)0x0;
  }
  else if (iLit == 1) {
    p_local = (Ifd_Man_t *)0xffffffffffffffff;
  }
  else {
    Fun._4_4_ = iLit;
    pIStack_18 = p;
    iVar1 = Abc_LitRegular(iLit);
    pIStack_28 = (Ifd_Man_t *)Ifd_ObjTruth_rec(p,iVar1,&local_2c);
    iVar1 = Abc_LitIsCompl(Fun._4_4_);
    if (iVar1 == 0) {
      local_40 = pIStack_28;
    }
    else {
      local_40 = (Ifd_Man_t *)((ulong)pIStack_28 ^ 0xffffffffffffffff);
    }
    p_local = local_40;
  }
  return (word)p_local;
}

Assistant:

word Ifd_ObjTruth( Ifd_Man_t * p, int iLit )
{
    word Fun;
    int Counter = 0;
    if ( iLit == 0 )
        return 0;
    if ( iLit == 1 )
        return ~(word)0;
    Fun = Ifd_ObjTruth_rec( p, Abc_LitRegular(iLit), &Counter );
    return Abc_LitIsCompl(iLit) ? ~Fun : Fun;
}